

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O0

shared_ptr<duckdb::BaseFileReader,_true>
duckdb::ParquetMultiFileInfo::CreateReader
          (ClientContext *context,OpenFileInfo *file,ParquetOptions *options,
          MultiFileOptions *param_4)

{
  ParquetOptions *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  OpenFileInfo *in_RSI;
  element_type *in_RDI;
  shared_ptr<duckdb::BaseFileReader,_true> sVar1;
  element_type *this;
  
  this = in_RDI;
  make_shared_ptr<duckdb::ParquetReader,duckdb::ClientContext&,duckdb::OpenFileInfo_const&,duckdb::ParquetOptions&>
            ((ClientContext *)in_RDI,in_RSI,in_RDX);
  shared_ptr<duckdb::BaseFileReader,_true>::shared_ptr<duckdb::ParquetReader,_0>
            ((shared_ptr<duckdb::BaseFileReader,_true> *)this,
             (shared_ptr<duckdb::ParquetReader,_true> *)in_RDI);
  shared_ptr<duckdb::ParquetReader,_true>::~shared_ptr
            ((shared_ptr<duckdb::ParquetReader,_true> *)0x62aefa);
  sVar1.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::BaseFileReader,_true>)
         sVar1.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseFileReader> ParquetMultiFileInfo::CreateReader(ClientContext &context, const OpenFileInfo &file,
                                                              ParquetOptions &options, const MultiFileOptions &) {
	return make_shared_ptr<ParquetReader>(context, file, options);
}